

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Barcode.cpp
# Opt level: O2

void __thiscall
ZXing::Result::Result
          (Result *this,string *text,int y,int xStart,int xStop,BarcodeFormat format,
          SymbologyIdentifier si,Error *error,bool readerInit)

{
  PointT<int> PVar1;
  PointT<int> PVar2;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  ByteArray::ByteArray((ByteArray *)&local_48,text);
  Content::Content(&this->_content,(ByteArray *)&local_48,si);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
  Error::Error(&this->_error,error);
  PVar1.y = y;
  PVar1.x = xStart;
  PVar2.y = y;
  PVar2.x = xStop;
  (this->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0] = PVar1;
  (this->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1] = PVar2;
  (this->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2] = PVar2;
  (this->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3] = PVar1;
  ReaderOptions::ReaderOptions(&this->_readerOpts);
  (this->_sai).index = -1;
  (this->_sai).count = -1;
  (this->_sai).id._M_dataplus._M_p = (pointer)&(this->_sai).id.field_2;
  (this->_sai).id._M_string_length = 0;
  (this->_sai).id.field_2._M_local_buf[0] = '\0';
  this->_format = format;
  this->_ecLevel[0] = '\0';
  this->_ecLevel[1] = '\0';
  this->_ecLevel[2] = '\0';
  this->_ecLevel[3] = '\0';
  this->_version[0] = '\0';
  this->_version[1] = '\0';
  this->_version[2] = '\0';
  this->_version[3] = '\0';
  *(undefined8 *)(this->_version + 2) = 0;
  this->_readerInit = readerInit;
  return;
}

Assistant:

Result::Result(const std::string& text, int y, int xStart, int xStop, BarcodeFormat format, SymbologyIdentifier si, Error error, bool readerInit)
	: _content({ByteArray(text)}, si),
	  _error(error),
	  _position(Line(y, xStart, xStop)),
	  _format(format),
	  _readerInit(readerInit)
{}